

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int bb_serial_read_open(int pi,uint user_gpio,uint baud,uint32_t bbBits)

{
  int iVar1;
  int in_ECX;
  gpioExtent_t *unaff_retaddr;
  int in_stack_00000008;
  gpioExtent_t ext [1];
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  iVar1 = pigpio_command_ext(in_ECX,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                             (int)((ulong)&stack0xfffffffffffffff0 >> 0x20),
                             (int)&stack0xfffffffffffffff0,0,unaff_retaddr,in_stack_00000008);
  return iVar1;
}

Assistant:

int bb_serial_read_open(int pi, unsigned user_gpio, unsigned baud, uint32_t bbBits)
{
   gpioExtent_t ext[1];
   
   /*
   p1=user_gpio
   p2=baud
   p3=4
   ## extension ##
   unsigned bbBits
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &bbBits;

   return pigpio_command_ext(
      pi, PI_CMD_SLRO, user_gpio, baud, 4, 1, ext, 1);
}